

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PRendezvousServer.cpp
# Opt level: O0

void __thiscall
MyServerConnection::OnData(MyServerConnection *this,uint32_t channel,uint8_t *data,uint32_t bytes)

{
  bool bVar1;
  int in_ECX;
  char *in_RDX;
  int in_ESI;
  SDKResult result;
  shared_ptr<MyServerConnection> *connection;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  *__range2;
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  connections;
  shared_ptr<MyServerConnection> receiver;
  shared_ptr<MyServerConnection> sender;
  TonkStatusEx status;
  LogStringBuffer buffer;
  LogStringBuffer buffer_1;
  LogStringBuffer buffer_2;
  LogStringBuffer buffer_3;
  undefined7 in_stack_ffffffffffffeb78;
  undefined1 in_stack_ffffffffffffeb7f;
  LogStringBuffer *in_stack_ffffffffffffeb80;
  SDKConnection *in_stack_ffffffffffffeb88;
  OutputWorker *in_stack_ffffffffffffeb90;
  SDKResult *in_stack_ffffffffffffeba8;
  Channel *pCVar2;
  LogStringBuffer *in_stack_ffffffffffffebb8;
  OutputWorker *in_stack_ffffffffffffebc0;
  SDKConnectionList<MyServerConnection> *in_stack_ffffffffffffebc8;
  string local_1320 [122];
  ushort local_12a6 [44];
  char local_124e [168];
  ushort local_11a6 [44];
  char local_114e [82];
  SDKResult local_10fc;
  reference local_10f8;
  shared_ptr<MyServerConnection> *local_10f0;
  __normal_iterator<std::shared_ptr<MyServerConnection>_*,_std::vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>_>
  local_10e8;
  undefined1 *local_10e0;
  undefined1 local_10c8 [24];
  __shared_ptr local_10b0 [16];
  __shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2> local_10a0 [4];
  char acStack_105e [40];
  ushort local_1036 [23];
  char *local_1008;
  ushort *local_ff0;
  char *local_fe8;
  char *local_fe0;
  char *local_fd8;
  Channel *local_fd0;
  ushort *local_fc8;
  char *local_fc0;
  char *local_fb8;
  char *local_fb0;
  Channel *local_fa8;
  ushort *local_fa0;
  char *local_f98;
  char *local_f90;
  char *local_f88;
  ushort *local_f80;
  char *local_f78;
  char *local_f70;
  char *local_f68;
  Channel *local_f60;
  string *local_f58;
  char *local_f50;
  Channel *local_f48;
  ushort *local_f40;
  char *local_f38;
  char *local_f30;
  char *local_f28;
  undefined4 local_f1c;
  Channel *local_f18;
  undefined4 local_f0c;
  Channel *local_f08;
  undefined1 local_ef0 [16];
  ostream aoStack_ee0 [376];
  ushort *local_d68;
  char *local_d60;
  char *local_d58;
  char *local_d50;
  undefined4 local_d44;
  Channel *local_d40;
  ushort *local_d38;
  char *local_d30;
  char *local_d28;
  char *local_d20;
  undefined8 local_d18;
  undefined1 *local_d10;
  Channel *local_d08;
  undefined8 local_d00;
  undefined1 *local_cf8;
  Channel *local_cf0;
  undefined8 local_ce8;
  undefined1 *local_ce0;
  ushort *local_cd8;
  char *local_cd0;
  char *local_cc8;
  char *local_cc0;
  undefined1 *local_cb8;
  Channel *local_cb0;
  ushort *local_ca8;
  char *local_ca0;
  char *local_c98;
  undefined1 *local_c90;
  Channel *local_c88;
  char *local_c80;
  undefined1 *local_c78;
  Channel *local_c70;
  ushort *local_c68;
  char *local_c60;
  undefined1 *local_c58;
  Channel *local_c50;
  char *local_c48;
  undefined1 *local_c40;
  char *local_c38;
  undefined1 *local_c30;
  Channel *local_c28;
  ushort *local_c20;
  undefined1 *local_c18;
  Channel *local_c10;
  char *local_c08;
  undefined1 *local_c00;
  ushort *local_bf8;
  undefined1 *local_bf0;
  char *local_be8;
  undefined1 *local_be0;
  Channel *local_bd8;
  char *local_bd0;
  undefined1 *local_bc8;
  ushort *local_bc0;
  char *local_bb8;
  char *local_bb0;
  char *local_ba8;
  undefined4 local_b9c;
  Channel *local_b98;
  undefined4 local_b8c;
  Channel *local_b88;
  undefined1 local_b70 [16];
  ostream aoStack_b60 [376];
  ushort *local_9e8;
  char *local_9e0;
  char *local_9d8;
  char *local_9d0;
  undefined4 local_9c4;
  Channel *local_9c0;
  ushort *local_9b8;
  char *local_9b0;
  char *local_9a8;
  char *local_9a0;
  undefined8 local_998;
  undefined1 *local_990;
  Channel *local_988;
  undefined8 local_980;
  undefined1 *local_978;
  Channel *local_970;
  undefined8 local_968;
  undefined1 *local_960;
  ushort *local_958;
  char *local_950;
  char *local_948;
  char *local_940;
  undefined1 *local_938;
  Channel *local_930;
  ushort *local_928;
  char *local_920;
  char *local_918;
  undefined1 *local_910;
  Channel *local_908;
  char *local_900;
  undefined1 *local_8f8;
  Channel *local_8f0;
  ushort *local_8e8;
  char *local_8e0;
  undefined1 *local_8d8;
  Channel *local_8d0;
  char *local_8c8;
  undefined1 *local_8c0;
  char *local_8b8;
  undefined1 *local_8b0;
  Channel *local_8a8;
  ushort *local_8a0;
  undefined1 *local_898;
  Channel *local_890;
  char *local_888;
  undefined1 *local_880;
  ushort *local_878;
  undefined1 *local_870;
  char *local_868;
  undefined1 *local_860;
  Channel *local_858;
  char *local_850;
  undefined1 *local_848;
  ushort *local_840;
  char *local_838;
  char *local_830;
  char *local_828;
  ushort *local_820;
  char *local_818;
  char *local_810;
  char *local_808;
  undefined4 local_7fc;
  Channel *local_7f8;
  undefined4 local_7ec;
  Channel *local_7e8;
  undefined1 local_7d0 [16];
  ostream aoStack_7c0 [376];
  ushort *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  ushort *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  undefined4 local_604;
  Channel *local_600;
  ushort *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  ushort *local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  undefined8 local_5b8;
  undefined1 *local_5b0;
  Channel *local_5a8;
  undefined8 local_5a0;
  undefined1 *local_598;
  Channel *local_590;
  undefined8 local_588;
  undefined1 *local_580;
  ushort *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  ushort *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  Channel *local_530;
  char *local_528;
  undefined1 *local_520;
  Channel *local_518;
  ushort *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  ushort *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  Channel *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  Channel *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  ushort *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  ushort *local_470;
  char *local_468;
  undefined1 *local_460;
  Channel *local_458;
  char *local_450;
  undefined1 *local_448;
  Channel *local_440;
  char *local_438;
  undefined1 *local_430;
  ushort *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  ushort *local_408;
  undefined1 *local_400;
  Channel *local_3f8;
  ushort *local_3f0;
  undefined1 *local_3e8;
  Channel *local_3e0;
  ushort *local_3d8;
  undefined1 *local_3d0;
  ushort *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  Channel *local_3a0;
  ushort *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  Channel *local_378;
  char *local_370;
  undefined1 *local_368;
  Channel *local_360;
  ushort *local_358;
  char *local_350;
  undefined1 *local_348;
  Channel *local_340;
  char *local_338;
  undefined1 *local_330;
  char *local_328;
  undefined1 *local_320;
  Channel *local_318;
  ushort *local_310;
  undefined1 *local_308;
  Channel *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  ushort *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  Channel *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  string *local_2b0;
  char *local_2a8;
  undefined4 local_29c;
  Channel *local_298;
  undefined4 local_28c;
  Channel *local_288;
  undefined1 local_270 [16];
  ostream aoStack_260 [376];
  string *local_e8;
  char *local_e0;
  undefined4 local_d4;
  Channel *local_d0;
  string *local_c8;
  char *local_c0;
  string *local_b8;
  undefined1 *local_b0;
  Channel *local_a8;
  string *local_a0;
  undefined1 *local_98;
  Channel *local_90;
  string *local_88;
  undefined1 *local_80;
  string *local_78;
  char *local_70;
  undefined1 *local_68;
  Channel *local_60;
  char *local_58;
  undefined1 *local_50;
  Channel *local_48;
  string *local_40;
  undefined1 *local_38;
  Channel *local_30;
  string *local_28;
  undefined1 *local_20;
  char *local_18;
  undefined1 *local_10;
  
  if ((in_ESI == 0x32) && (in_ECX == 1)) {
    local_1008 = in_RDX;
    tonk::SDKConnection::GetStatusEx((SDKConnection *)in_stack_ffffffffffffeb80);
    if (*local_1008 == '\x01') {
      local_fe0 = acStack_105e;
      local_ff0 = local_1036;
      local_fd0 = &Logger;
      local_fd8 = "Receiver from ";
      local_fe8 = " : ";
      local_f18 = &Logger;
      local_f1c = 2;
      local_f28 = "Receiver from ";
      local_f38 = " : ";
      local_f08 = &Logger;
      local_f0c = 2;
      local_f40 = local_ff0;
      local_f30 = local_fe0;
      if ((int)Logger.ChannelMinLevel < 3) {
        local_d40 = &Logger;
        local_d44 = 2;
        local_d50 = "Receiver from ";
        local_d60 = " : ";
        local_d68 = local_ff0;
        local_d58 = local_fe0;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_ffffffffffffeb80,
                   (char *)CONCAT17(in_stack_ffffffffffffeb7f,in_stack_ffffffffffffeb78),Trace);
        local_d18 = 0x1182f8;
        local_d08 = &Logger;
        local_d20 = local_d50;
        local_d28 = local_d58;
        local_d30 = local_d60;
        local_d38 = local_d68;
        local_cf0 = &Logger;
        local_d10 = local_ef0;
        local_d00 = local_d18;
        local_cf8 = local_ef0;
        local_ce8 = local_d18;
        local_ce0 = local_ef0;
        std::operator<<(aoStack_ee0,(string *)&Logger.Prefix);
        local_cb0 = &Logger;
        local_cb8 = local_d10;
        local_cc0 = local_d20;
        local_cc8 = local_d28;
        local_cd0 = local_d30;
        local_cd8 = local_d38;
        local_bd8 = &Logger;
        local_be0 = local_d10;
        local_be8 = local_d20;
        local_bc8 = local_d10;
        local_bd0 = local_d20;
        std::operator<<((ostream *)(local_d10 + 0x10),local_d20);
        local_c88 = &Logger;
        local_c90 = local_cb8;
        local_c98 = local_cc8;
        local_ca0 = local_cd0;
        local_ca8 = local_cd8;
        local_c70 = &Logger;
        local_c78 = local_cb8;
        local_c80 = local_cc8;
        local_c40 = local_cb8;
        local_c48 = local_cc8;
        std::operator<<((ostream *)(local_cb8 + 0x10),local_cc8);
        local_c50 = &Logger;
        local_c58 = local_c90;
        local_c60 = local_ca0;
        local_c68 = local_ca8;
        local_c28 = &Logger;
        local_c30 = local_c90;
        local_c38 = local_ca0;
        local_c00 = local_c90;
        local_c08 = local_ca0;
        std::operator<<((ostream *)(local_c90 + 0x10),local_ca0);
        local_c10 = &Logger;
        local_c18 = local_c58;
        local_c20 = local_c68;
        local_bf0 = local_c58;
        local_bf8 = local_c68;
        std::ostream::operator<<((ostream *)(local_c58 + 0x10),*local_c68);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x104084);
      }
      std::atomic<bool>::operator=
                ((atomic<bool> *)in_stack_ffffffffffffeb80,(bool)in_stack_ffffffffffffeb7f);
    }
    else if (*local_1008 == '\0') {
      local_fb8 = acStack_105e;
      local_fc8 = local_1036;
      local_fa8 = &Logger;
      local_fb0 = "Sender from ";
      local_fc0 = " : ";
      local_b98 = &Logger;
      local_b9c = 2;
      local_ba8 = "Sender from ";
      local_bb8 = " : ";
      local_b88 = &Logger;
      local_b8c = 2;
      local_bc0 = local_fc8;
      local_bb0 = local_fb8;
      if ((int)Logger.ChannelMinLevel < 3) {
        local_9c0 = &Logger;
        local_9c4 = 2;
        local_9d0 = "Sender from ";
        local_9e0 = " : ";
        local_9e8 = local_fc8;
        local_9d8 = local_fb8;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_ffffffffffffeb80,
                   (char *)CONCAT17(in_stack_ffffffffffffeb7f,in_stack_ffffffffffffeb78),Trace);
        local_998 = 0x1182f8;
        local_988 = &Logger;
        local_9a0 = local_9d0;
        local_9a8 = local_9d8;
        local_9b0 = local_9e0;
        local_9b8 = local_9e8;
        local_970 = &Logger;
        local_990 = local_b70;
        local_980 = local_998;
        local_978 = local_b70;
        local_968 = local_998;
        local_960 = local_b70;
        std::operator<<(aoStack_b60,(string *)&Logger.Prefix);
        local_930 = &Logger;
        local_938 = local_990;
        local_940 = local_9a0;
        local_948 = local_9a8;
        local_950 = local_9b0;
        local_958 = local_9b8;
        local_858 = &Logger;
        local_860 = local_990;
        local_868 = local_9a0;
        local_848 = local_990;
        local_850 = local_9a0;
        std::operator<<((ostream *)(local_990 + 0x10),local_9a0);
        local_908 = &Logger;
        local_910 = local_938;
        local_918 = local_948;
        local_920 = local_950;
        local_928 = local_958;
        local_8f0 = &Logger;
        local_8f8 = local_938;
        local_900 = local_948;
        local_8c0 = local_938;
        local_8c8 = local_948;
        std::operator<<((ostream *)(local_938 + 0x10),local_948);
        local_8d0 = &Logger;
        local_8d8 = local_910;
        local_8e0 = local_920;
        local_8e8 = local_928;
        local_8a8 = &Logger;
        local_8b0 = local_910;
        local_8b8 = local_920;
        local_880 = local_910;
        local_888 = local_920;
        std::operator<<((ostream *)(local_910 + 0x10),local_920);
        local_890 = &Logger;
        local_898 = local_8d8;
        local_8a0 = local_8e8;
        local_870 = local_8d8;
        local_878 = local_8e8;
        std::ostream::operator<<((ostream *)(local_8d8 + 0x10),*local_8e8);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10463c);
      }
      std::atomic<bool>::operator=
                ((atomic<bool> *)in_stack_ffffffffffffeb80,(bool)in_stack_ffffffffffffeb7f);
    }
    std::shared_ptr<MyServerConnection>::shared_ptr((shared_ptr<MyServerConnection> *)0x104661);
    std::shared_ptr<MyServerConnection>::shared_ptr((shared_ptr<MyServerConnection> *)0x10466e);
    tonk::SDKConnectionList<MyServerConnection>::GetList(in_stack_ffffffffffffebc8);
    local_10e0 = local_10c8;
    local_10e8._M_current =
         (shared_ptr<MyServerConnection> *)
         std::
         vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
         ::begin((vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
                  *)CONCAT17(in_stack_ffffffffffffeb7f,in_stack_ffffffffffffeb78));
    local_10f0 = (shared_ptr<MyServerConnection> *)
                 std::
                 vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
                 ::end((vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
                        *)CONCAT17(in_stack_ffffffffffffeb7f,in_stack_ffffffffffffeb78));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<MyServerConnection>_*,_std::vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>_>
                               *)in_stack_ffffffffffffeb80,
                              (__normal_iterator<std::shared_ptr<MyServerConnection>_*,_std::vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>_>
                               *)CONCAT17(in_stack_ffffffffffffeb7f,in_stack_ffffffffffffeb78)),
          bVar1) {
      local_10f8 = __gnu_cxx::
                   __normal_iterator<std::shared_ptr<MyServerConnection>_*,_std::vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>_>
                   ::operator*(&local_10e8);
      std::__shared_ptr_access<MyServerConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<MyServerConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x10470a);
      bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffeb88);
      if (bVar1) {
        std::shared_ptr<MyServerConnection>::operator=
                  ((shared_ptr<MyServerConnection> *)in_stack_ffffffffffffeb80,
                   (shared_ptr<MyServerConnection> *)
                   CONCAT17(in_stack_ffffffffffffeb7f,in_stack_ffffffffffffeb78));
      }
      else {
        std::__shared_ptr_access<MyServerConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<MyServerConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x104759);
        bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffeb88);
        if (bVar1) {
          std::shared_ptr<MyServerConnection>::operator=
                    ((shared_ptr<MyServerConnection> *)in_stack_ffffffffffffeb80,
                     (shared_ptr<MyServerConnection> *)
                     CONCAT17(in_stack_ffffffffffffeb7f,in_stack_ffffffffffffeb78));
        }
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<MyServerConnection>_*,_std::vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>_>
      ::operator++(&local_10e8);
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_10a0);
    if ((bVar1) && (bVar1 = std::__shared_ptr::operator_cast_to_bool(local_10b0), bVar1)) {
      std::__shared_ptr_access<MyServerConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<MyServerConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1047cf);
      std::__shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>::get(local_10a0);
      local_10fc = tonk::SDKConnection::P2PConnect
                             (in_stack_ffffffffffffeb88,(SDKConnection *)in_stack_ffffffffffffeb80);
      bVar1 = tonk::SDKResult::Good(&local_10fc);
      if (bVar1) {
        std::__shared_ptr_access<MyServerConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<MyServerConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x10483e);
        tonk::SDKConnection::GetStatusEx((SDKConnection *)in_stack_ffffffffffffeb80);
        std::__shared_ptr_access<MyServerConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<MyServerConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x10486d);
        tonk::SDKConnection::GetStatusEx((SDKConnection *)in_stack_ffffffffffffeb80);
        std::__shared_ptr_access<MyServerConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<MyServerConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x10489c);
        tonk::SDKConnection::GetStatusEx((SDKConnection *)in_stack_ffffffffffffeb80);
        std::__shared_ptr_access<MyServerConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<MyServerConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1048cb);
        tonk::SDKConnection::GetStatusEx((SDKConnection *)in_stack_ffffffffffffeb80);
        local_fa0 = local_12a6;
        local_f60 = &Logger;
        local_f68 = "P2P connection started between ";
        local_f78 = " : ";
        local_f88 = " <-> ";
        local_f98 = " : ";
        local_7f8 = &Logger;
        local_7fc = 2;
        local_808 = "P2P connection started between ";
        local_818 = " : ";
        local_828 = " <-> ";
        local_838 = " : ";
        local_7e8 = &Logger;
        local_7ec = 2;
        local_f90 = local_124e;
        local_f80 = local_11a6;
        local_f70 = local_114e;
        local_840 = local_fa0;
        local_830 = local_124e;
        local_820 = local_11a6;
        local_810 = local_114e;
        if ((int)Logger.ChannelMinLevel < 3) {
          local_600 = &Logger;
          local_604 = 2;
          local_610 = "P2P connection started between ";
          local_620 = " : ";
          local_630 = " <-> ";
          local_640 = " : ";
          local_648 = local_fa0;
          local_638 = local_124e;
          local_628 = local_11a6;
          local_618 = local_114e;
          logger::LogStringBuffer::LogStringBuffer
                    (in_stack_ffffffffffffeb80,
                     (char *)CONCAT17(in_stack_ffffffffffffeb7f,in_stack_ffffffffffffeb78),Trace);
          local_5b8 = 0x1182f8;
          local_5a8 = &Logger;
          local_5b0 = local_7d0;
          local_5c0 = local_610;
          local_5c8 = local_618;
          local_5d0 = local_620;
          local_5d8 = local_628;
          local_5e0 = local_630;
          local_5e8 = local_638;
          local_5f0 = local_640;
          local_5f8 = local_648;
          local_590 = &Logger;
          local_5a0 = local_5b8;
          local_598 = local_5b0;
          local_588 = local_5b8;
          local_580 = local_5b0;
          std::operator<<(aoStack_7c0,(string *)&Logger.Prefix);
          local_530 = &Logger;
          local_538 = local_5b0;
          local_540 = local_5c0;
          local_548 = local_5c8;
          local_550 = local_5d0;
          local_558 = local_5d8;
          local_560 = local_5e0;
          local_568 = local_5e8;
          local_570 = local_5f0;
          local_578 = local_5f8;
          local_518 = &Logger;
          local_520 = local_5b0;
          local_528 = local_5c0;
          local_498 = local_5b0;
          local_4a0 = local_5c0;
          std::operator<<((ostream *)(local_5b0 + 0x10),local_5c0);
          local_4d0 = &Logger;
          local_4d8 = local_538;
          local_4e0 = local_548;
          local_4e8 = local_550;
          local_4f0 = local_558;
          local_4f8 = local_560;
          local_500 = local_568;
          local_508 = local_570;
          local_510 = local_578;
          local_4b8 = &Logger;
          local_4c0 = local_538;
          local_4c8 = local_548;
          local_4a8 = local_538;
          local_4b0 = local_548;
          std::operator<<((ostream *)(local_538 + 0x10),local_548);
          local_458 = &Logger;
          local_460 = local_4d8;
          local_468 = local_4e8;
          local_470 = local_4f0;
          local_478 = local_4f8;
          local_480 = local_500;
          local_488 = local_508;
          local_490 = local_510;
          local_440 = &Logger;
          local_448 = local_4d8;
          local_450 = local_4e8;
          local_430 = local_4d8;
          local_438 = local_4e8;
          std::operator<<((ostream *)(local_4d8 + 0x10),local_4e8);
          local_3f8 = &Logger;
          local_400 = local_460;
          local_408 = local_470;
          local_410 = local_478;
          local_418 = local_480;
          local_420 = local_488;
          local_428 = local_490;
          local_3e0 = &Logger;
          local_3e8 = local_460;
          local_3f0 = local_470;
          local_3d0 = local_460;
          local_3d8 = local_470;
          std::ostream::operator<<((ostream *)(local_460 + 0x10),*local_470);
          local_3a0 = &Logger;
          local_3a8 = local_400;
          local_3b0 = local_410;
          local_3b8 = local_418;
          local_3c0 = local_420;
          local_3c8 = local_428;
          local_2c8 = &Logger;
          local_2d0 = local_400;
          local_2d8 = local_410;
          local_2b8 = local_400;
          local_2c0 = local_410;
          std::operator<<((ostream *)(local_400 + 0x10),local_410);
          local_378 = &Logger;
          local_380 = local_3a8;
          local_388 = local_3b8;
          local_390 = local_3c0;
          local_398 = local_3c8;
          local_360 = &Logger;
          local_368 = local_3a8;
          local_370 = local_3b8;
          local_330 = local_3a8;
          local_338 = local_3b8;
          std::operator<<((ostream *)(local_3a8 + 0x10),local_3b8);
          local_340 = &Logger;
          local_348 = local_380;
          local_350 = local_390;
          local_358 = local_398;
          local_318 = &Logger;
          local_320 = local_380;
          local_328 = local_390;
          local_2f0 = local_380;
          local_2f8 = local_390;
          std::operator<<((ostream *)(local_380 + 0x10),local_390);
          local_300 = &Logger;
          local_308 = local_348;
          local_310 = local_358;
          local_2e0 = local_348;
          local_2e8 = local_358;
          std::ostream::operator<<((ostream *)(local_348 + 0x10),*local_358);
          logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x105338);
        }
      }
      else {
        tonk::SDKResult::ToString_abi_cxx11_(in_stack_ffffffffffffeba8);
        local_f48 = &Logger;
        local_f50 = "P2P connection failed: ";
        local_f58 = local_1320;
        local_298 = &Logger;
        local_29c = 3;
        local_2a8 = "P2P connection failed: ";
        local_288 = &Logger;
        local_28c = 3;
        local_2b0 = local_f58;
        if ((int)Logger.ChannelMinLevel < 4) {
          local_d0 = &Logger;
          local_d4 = 3;
          local_e0 = "P2P connection failed: ";
          pCVar2 = &Logger;
          local_e8 = local_f58;
          logger::LogStringBuffer::LogStringBuffer
                    (in_stack_ffffffffffffeb80,
                     (char *)CONCAT17(in_stack_ffffffffffffeb7f,in_stack_ffffffffffffeb78),Trace);
          local_b8 = &pCVar2->Prefix;
          local_b0 = local_270;
          local_c0 = local_e0;
          local_c8 = local_e8;
          local_a8 = pCVar2;
          local_a0 = local_b8;
          local_98 = local_b0;
          local_90 = pCVar2;
          local_88 = local_b8;
          local_80 = local_b0;
          std::operator<<(aoStack_260,(string *)local_b8);
          local_68 = local_b0;
          local_70 = local_c0;
          local_78 = local_c8;
          local_50 = local_b0;
          local_58 = local_c0;
          local_10 = local_b0;
          local_18 = local_c0;
          local_60 = pCVar2;
          local_48 = pCVar2;
          std::operator<<((ostream *)(local_b0 + 0x10),local_c0);
          local_38 = local_68;
          local_40 = local_78;
          local_20 = local_68;
          local_28 = local_78;
          local_30 = pCVar2;
          std::operator<<((ostream *)(local_68 + 0x10),local_78);
          in_stack_ffffffffffffeb90 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1056cf);
        }
        std::__cxx11::string::~string(local_1320);
      }
    }
    std::
    vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
    ::~vector((vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
               *)in_stack_ffffffffffffeb90);
    std::shared_ptr<MyServerConnection>::~shared_ptr((shared_ptr<MyServerConnection> *)0x105737);
    std::shared_ptr<MyServerConnection>::~shared_ptr((shared_ptr<MyServerConnection> *)0x105744);
  }
  return;
}

Assistant:

void MyServerConnection::OnData(
    uint32_t          channel,  // Channel number attached to each message by sender
    const uint8_t*       data,  // Pointer to a buffer containing the message data
    uint32_t            bytes   // Number of bytes in the message
)
{
    if (channel == TonkChannel_Reliable0 && bytes == 1)
    {
        auto status = GetStatusEx();

        if (data[0] == 1) {
            Logger.Info("Receiver from ", status.Remote.NetworkString, " : ", status.Remote.UDPPort);
            IsReceiver = true;
        }
        else if (data[0] == 0) {
            Logger.Info("Sender from ", status.Remote.NetworkString, " : ", status.Remote.UDPPort);
            IsSender = true;
        }

        std::shared_ptr<MyServerConnection> sender, receiver;

        auto connections = Server->ConnectionList.GetList();
        for (auto& connection : connections)
        {
            if (connection->IsReceiver) {
                receiver = connection;
            }
            else if (connection->IsSender) {
                sender = connection;
            }
        }

        if (sender && receiver)
        {
            auto result = receiver->P2PConnect(sender.get());

            if (result.Good())
            {
                Logger.Info("P2P connection started between ",
                    sender->GetStatusEx().Remote.NetworkString, " : ",
                    sender->GetStatusEx().Remote.UDPPort, " <-> ",
                    receiver->GetStatusEx().Remote.NetworkString, " : ",
                    receiver->GetStatusEx().Remote.UDPPort);
            }
            else
            {
                Logger.Warning("P2P connection failed: ", result.ToString());
            }
        }
    }
}